

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* fmt::v8::
  make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,std::__cxx11::string&,std::__cxx11::string_const&>
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
            basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  size_t sVar1;
  size_t sVar2;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  bool formattable;
  bool formattable_pointer;
  bool formattable_const;
  bool formattable_char;
  basic_string_view<char> *arg;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_const_1;
  bool formattable_char_1;
  basic_string_view<char> *arg_1;
  undefined1 local_119;
  char *local_118;
  size_t sStack_110;
  char **local_108;
  char *local_f8 [4];
  undefined1 *local_d8;
  basic_string_view<char> local_d0;
  char **local_c0;
  basic_string_view<char> local_b8;
  char *local_a8;
  size_t sStack_a0;
  undefined1 local_8d;
  undefined1 local_8c;
  undefined1 local_8b;
  undefined1 local_8a;
  undefined1 local_89;
  char *local_88;
  size_t sStack_80;
  char **local_78;
  char *local_68 [3];
  undefined1 *local_50;
  basic_string_view<char> local_48;
  char **local_38;
  basic_string_view<char> local_30 [3];
  
  local_d8 = &local_119;
  local_d0 = to_string_view<char,std::char_traits<char>,std::allocator<char>>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x19bba6);
  local_118 = local_d0.data_;
  sStack_110 = local_d0.size_;
  local_108 = &local_118;
  local_b8.data_ = local_d0.data_;
  local_b8.size_ = local_d0.size_;
  local_c0 = local_f8;
  local_f8[0] = basic_string_view<char>::data(&local_b8);
  sVar1 = basic_string_view<char>::size(&local_b8);
  local_50 = &local_89;
  local_48 = to_string_view<char,std::char_traits<char>,std::allocator<char>>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x19bcdb);
  local_88 = local_48.data_;
  sStack_80 = local_48.size_;
  local_78 = &local_88;
  local_8a = 1;
  local_8b = 1;
  local_8c = 1;
  local_8d = 1;
  local_a8 = local_48.data_;
  sStack_a0 = local_48.size_;
  local_38 = local_68;
  local_30[0].data_ = local_a8;
  local_30[0].size_ = sStack_a0;
  local_68[0] = basic_string_view<char>::data(local_30);
  sVar2 = basic_string_view<char>::size(local_30);
  (in_RDI->data_).args_[0].field_0.string.data = local_f8[0];
  (in_RDI->data_).args_[0].field_0.string.size = sVar1;
  (in_RDI->data_).args_[1].field_0.string.data = local_68[0];
  (in_RDI->data_).args_[1].field_0.string.size = sVar2;
  return in_RDI;
}

Assistant:

constexpr auto make_format_args(Args&&... args)
    -> format_arg_store<Context, remove_cvref_t<Args>...> {
  return {std::forward<Args>(args)...};
}